

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_alloc.c
# Opt level: O0

void * ngx_memalign(size_t alignment,size_t size,ngx_log_t *log)

{
  int err_00;
  void *pvStack_28;
  int err;
  void *p;
  ngx_log_t *log_local;
  size_t size_local;
  size_t alignment_local;
  
  p = log;
  log_local = (ngx_log_t *)size;
  size_local = alignment;
  err_00 = posix_memalign(&stack0xffffffffffffffd8,alignment,size);
  if (err_00 != 0) {
    if (*p != 0) {
      ngx_log_error_core(1,(ngx_log_t *)p,err_00,"posix_memalign(%uz, %uz) failed",size_local,
                         log_local);
    }
    pvStack_28 = (void *)0x0;
  }
  if ((*p & 0x20) != 0) {
    ngx_log_error_core(8,(ngx_log_t *)p,0,"posix_memalign: %p:%uz @%uz",pvStack_28,log_local,
                       size_local);
  }
  return pvStack_28;
}

Assistant:

void *
ngx_memalign(size_t alignment, size_t size, ngx_log_t *log)
{
    void  *p;
    int    err;

    err = posix_memalign(&p, alignment, size);

    if (err) {
        ngx_log_error(NGX_LOG_EMERG, log, err,
                      "posix_memalign(%uz, %uz) failed", alignment, size);
        p = NULL;
    }

    ngx_log_debug3(NGX_LOG_DEBUG_ALLOC, log, 0,
                   "posix_memalign: %p:%uz @%uz", p, size, alignment);

    return p;
}